

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MGraph.c
# Opt level: O1

void sorted_edges(EData *edges,int elen)

{
  EData EVar1;
  ulong uVar2;
  ulong uVar3;
  EData *pEVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (0 < elen) {
    uVar2 = (ulong)(uint)elen;
    uVar3 = uVar2;
    pEVar4 = edges;
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      if (uVar6 < uVar2) {
        uVar7 = 1;
        do {
          if (pEVar4[uVar7].weight < edges[uVar5].weight) {
            EVar1 = edges[uVar5];
            edges[uVar5] = pEVar4[uVar7];
            pEVar4[uVar7] = EVar1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      pEVar4 = pEVar4 + 1;
      uVar3 = uVar3 - 1;
      uVar5 = uVar6;
    } while (uVar6 != uVar2);
  }
  return;
}

Assistant:

void sorted_edges(EData* edges, int elen)
{
    int i,j;

    for (int i = 0; i < elen; ++i) {
        for (int j = i + 1; j < elen; ++j) {
            if (edges[i].weight > edges[j].weight){
                //交换"第i条边"和"第j条边"
                EData tmp = edges[i];
                edges[i] = edges[j];
                edges[j] = tmp;
            }
        }
    }
}